

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

void * LZ4_createHC(char *inputBuffer)

{
  int iVar1;
  void *__s;
  ulong uVar2;
  
  __s = calloc(1,0x40038);
  if (__s == (void *)0x0) {
    __s = (void *)0x0;
  }
  else {
    *(undefined2 *)((long)__s + 0x40024) = 9;
  }
  if (__s == (void *)0x0) {
    __s = (void *)0x0;
  }
  else {
    uVar2 = *(long *)((long)__s + 0x40000) - *(long *)((long)__s + 0x40008);
    if (0x40000000 < uVar2) {
      uVar2 = 0;
      memset(__s,0,0x20000);
      memset((void *)((long)__s + 0x20000),0xff,0x20000);
    }
    iVar1 = (int)uVar2 + 0x10000;
    *(int *)((long)__s + 0x40020) = iVar1;
    *(char **)((long)__s + 0x40008) = inputBuffer + (-0x10000 - uVar2);
    *(char **)((long)__s + 0x40000) = inputBuffer;
    *(char **)((long)__s + 0x40010) = inputBuffer + (-0x10000 - uVar2);
    *(int *)((long)__s + 0x40018) = iVar1;
    *(int *)((long)__s + 0x4001c) = iVar1;
  }
  return __s;
}

Assistant:

void* LZ4_createHC (const char* inputBuffer)
{
    LZ4_streamHC_t* const hc4 = LZ4_createStreamHC();
    if (hc4 == NULL) return NULL;   /* not enough memory */
    LZ4HC_init_internal (&hc4->internal_donotuse, (const BYTE*)inputBuffer);
    return hc4;
}